

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_markdown_generator.cc
# Opt level: O0

void __thiscall
t_markdown_generator::print_fn_args_doc(t_markdown_generator *this,t_function *tfunction)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  t_struct *ptVar4;
  members_type *pmVar5;
  ulong uVar6;
  ostream *poVar7;
  reference pptVar8;
  t_type *ptVar9;
  undefined4 extraout_var;
  string *psVar10;
  string local_100;
  __normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_e0;
  t_field **local_d8;
  __normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_d0;
  __normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_c8;
  __normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_c0;
  iterator ex_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> excepts;
  __normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_80;
  int local_74;
  iterator iStack_70;
  int n;
  t_field **local_68;
  __normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_50;
  __normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_48;
  __normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_40;
  iterator arg_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> args;
  bool has_docs;
  t_function *tfunction_local;
  t_markdown_generator *this_local;
  
  bVar2 = false;
  ptVar4 = t_function::get_arglist(tfunction);
  pmVar5 = t_struct::get_members(ptVar4);
  std::vector<t_field_*,_std::allocator<t_field_*>_>::vector
            ((vector<t_field_*,_std::allocator<t_field_*>_> *)&arg_iter,pmVar5);
  local_40._M_current =
       (t_field **)
       std::vector<t_field_*,_std::allocator<t_field_*>_>::begin
                 ((vector<t_field_*,_std::allocator<t_field_*>_> *)&arg_iter);
  local_48._M_current =
       (t_field **)
       std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                 ((vector<t_field_*,_std::allocator<t_field_*>_> *)&arg_iter);
  bVar1 = __gnu_cxx::operator!=(&local_40,&local_48);
  if (bVar1) {
    while( true ) {
      local_50._M_current =
           (t_field **)
           std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                     ((vector<t_field_*,_std::allocator<t_field_*>_> *)&arg_iter);
      bVar1 = __gnu_cxx::operator!=(&local_40,&local_50);
      if (!bVar1) break;
      pptVar8 = __gnu_cxx::
                __normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
                operator*(&local_40);
      bVar1 = t_doc::has_doc(&(*pptVar8)->super_t_doc);
      if (bVar1) {
        pptVar8 = __gnu_cxx::
                  __normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&local_40);
        t_doc::get_doc_abi_cxx11_(&(*pptVar8)->super_t_doc);
        uVar6 = std::__cxx11::string::empty();
        if ((uVar6 & 1) == 0) {
          bVar2 = true;
          break;
        }
      }
      local_68 = (t_field **)
                 __gnu_cxx::
                 __normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                 ::operator++(&local_40,0);
    }
    if (bVar2) {
      iStack_70 = std::vector<t_field_*,_std::allocator<t_field_*>_>::begin
                            ((vector<t_field_*,_std::allocator<t_field_*>_> *)&arg_iter);
      local_40._M_current = iStack_70._M_current;
      poVar7 = std::operator<<((ostream *)&this->f_out_,'\n');
      poVar7 = std::operator<<(poVar7,"* parameters:");
      std::operator<<(poVar7,'\n');
      local_74 = 1;
      while( true ) {
        local_80._M_current =
             (t_field **)
             std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                       ((vector<t_field_*,_std::allocator<t_field_*>_> *)&arg_iter);
        bVar1 = __gnu_cxx::operator!=(&local_40,&local_80);
        if (!bVar1) break;
        poVar7 = (ostream *)std::ostream::operator<<(&this->f_out_,local_74);
        poVar7 = std::operator<<(poVar7,". ");
        pptVar8 = __gnu_cxx::
                  __normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&local_40);
        psVar10 = t_field::get_name_abi_cxx11_(*pptVar8);
        std::operator<<(poVar7,(string *)psVar10);
        poVar7 = std::operator<<((ostream *)&this->f_out_," - ");
        pptVar8 = __gnu_cxx::
                  __normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&local_40);
        psVar10 = t_doc::get_doc_abi_cxx11_(&(*pptVar8)->super_t_doc);
        escape_html((string *)
                    &excepts.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,this,psVar10);
        std::operator<<(poVar7,(string *)
                               &excepts.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::~string
                  ((string *)
                   &excepts.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        std::operator<<((ostream *)&this->f_out_,'\n');
        __gnu_cxx::
        __normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
        operator++(&local_40);
        local_74 = local_74 + 1;
      }
      std::operator<<((ostream *)&this->f_out_,'\n');
    }
  }
  if (!bVar2) {
    std::operator<<((ostream *)&this->f_out_,'\n');
  }
  bVar2 = false;
  ptVar4 = t_function::get_xceptions(tfunction);
  pmVar5 = t_struct::get_members(ptVar4);
  std::vector<t_field_*,_std::allocator<t_field_*>_>::vector
            ((vector<t_field_*,_std::allocator<t_field_*>_> *)&ex_iter,pmVar5);
  local_c0._M_current =
       (t_field **)
       std::vector<t_field_*,_std::allocator<t_field_*>_>::begin
                 ((vector<t_field_*,_std::allocator<t_field_*>_> *)&ex_iter);
  local_c8._M_current =
       (t_field **)
       std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                 ((vector<t_field_*,_std::allocator<t_field_*>_> *)&ex_iter);
  bVar1 = __gnu_cxx::operator!=(&local_c0,&local_c8);
  if (bVar1) {
    while( true ) {
      local_d0._M_current =
           (t_field **)
           std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                     ((vector<t_field_*,_std::allocator<t_field_*>_> *)&ex_iter);
      bVar1 = __gnu_cxx::operator!=(&local_c0,&local_d0);
      if (!bVar1) break;
      pptVar8 = __gnu_cxx::
                __normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
                operator*(&local_c0);
      bVar1 = t_doc::has_doc(&(*pptVar8)->super_t_doc);
      if (bVar1) {
        pptVar8 = __gnu_cxx::
                  __normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&local_c0);
        t_doc::get_doc_abi_cxx11_(&(*pptVar8)->super_t_doc);
        uVar6 = std::__cxx11::string::empty();
        if ((uVar6 & 1) == 0) {
          bVar2 = true;
          break;
        }
      }
      __gnu_cxx::__normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
      ::operator++(&local_c0);
    }
    if (bVar2) {
      local_d8 = (t_field **)
                 std::vector<t_field_*,_std::allocator<t_field_*>_>::begin
                           ((vector<t_field_*,_std::allocator<t_field_*>_> *)&ex_iter);
      local_c0._M_current = local_d8;
      poVar7 = std::operator<<((ostream *)&this->f_out_,"* exceptions:");
      std::operator<<(poVar7,'\n');
      while( true ) {
        local_e0._M_current =
             (t_field **)
             std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                       ((vector<t_field_*,_std::allocator<t_field_*>_> *)&ex_iter);
        bVar2 = __gnu_cxx::operator!=(&local_c0,&local_e0);
        if (!bVar2) break;
        poVar7 = std::operator<<((ostream *)&this->f_out_,"  * ");
        pptVar8 = __gnu_cxx::
                  __normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&local_c0);
        ptVar9 = t_field::get_type(*pptVar8);
        iVar3 = (*(ptVar9->super_t_doc)._vptr_t_doc[3])();
        std::operator<<(poVar7,(string *)CONCAT44(extraout_var,iVar3));
        std::operator<<((ostream *)&this->f_out_," - ");
        pptVar8 = __gnu_cxx::
                  __normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&local_c0);
        psVar10 = t_doc::get_doc_abi_cxx11_(&(*pptVar8)->super_t_doc);
        escape_html(&local_100,this,psVar10);
        std::operator<<((ostream *)&this->f_out_,(string *)&local_100);
        std::__cxx11::string::~string((string *)&local_100);
        std::operator<<((ostream *)&this->f_out_,'\n');
        __gnu_cxx::
        __normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
        operator++(&local_c0,0);
      }
      std::operator<<((ostream *)&this->f_out_,'\n');
    }
  }
  std::vector<t_field_*,_std::allocator<t_field_*>_>::~vector
            ((vector<t_field_*,_std::allocator<t_field_*>_> *)&ex_iter);
  std::vector<t_field_*,_std::allocator<t_field_*>_>::~vector
            ((vector<t_field_*,_std::allocator<t_field_*>_> *)&arg_iter);
  return;
}

Assistant:

void t_markdown_generator::print_fn_args_doc(t_function* tfunction) {
  bool has_docs = false;
  vector<t_field*> args = tfunction->get_arglist()->get_members();
  vector<t_field*>::iterator arg_iter = args.begin();
  if (arg_iter != args.end()) {
    for (; arg_iter != args.end(); arg_iter++) {
      if ((*arg_iter)->has_doc() && !(*arg_iter)->get_doc().empty()) {
        has_docs = true;
        break;
      }
    }
    if (has_docs) {
      arg_iter = args.begin();
      f_out_ << endl << "* parameters:" << endl;
      for (int n = 1; arg_iter != args.end(); ++arg_iter, ++n ) {
        f_out_ << n << ". " << (*arg_iter)->get_name();
        f_out_ << " - " << escape_html((*arg_iter)->get_doc());
        f_out_ << endl;
      }
      f_out_ << endl;
    }
  }
  if(!has_docs) 
    f_out_ << endl;

  has_docs = false;
  vector<t_field*> excepts = tfunction->get_xceptions()->get_members();
  vector<t_field*>::iterator ex_iter = excepts.begin();
  if (ex_iter != excepts.end()) {
    for (; ex_iter != excepts.end(); ++ex_iter) {
      if ((*ex_iter)->has_doc() && !(*ex_iter)->get_doc().empty()) {
        has_docs = true;
        break;
      }
    }
    if (has_docs) {
      ex_iter = excepts.begin();
      f_out_ << "* exceptions:" << endl;
      for (; ex_iter != excepts.end(); ex_iter++) {
        f_out_ << "  * " << (*ex_iter)->get_type()->get_name();
        f_out_ << " - ";
        f_out_ << escape_html((*ex_iter)->get_doc());
        f_out_ << endl;
      }
      f_out_ << endl;
    }
  }
}